

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::TemplatedWritePlain<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  uint64_t *puVar1;
  long lVar2;
  long lVar3;
  uhugeint_t uVar4;
  double local_write [2048];
  double local_4040;
  double local_4038 [2049];
  
  lVar2 = chunk_start - (long)stats;
  if (chunk_start < stats || lVar2 == 0) {
    lVar3 = 0;
  }
  else {
    puVar1 = (uint64_t *)((long)stats * 0x10 + *(long *)(col + 0x20) + 8);
    lVar3 = 0;
    do {
      local_4040 = 0.0;
      uVar4.upper = *puVar1;
      uVar4.lower = puVar1[-1];
      duckdb::Uhugeint::TryCast<double>(uVar4,&local_4040);
      local_4038[lVar3] = local_4040;
      lVar3 = lVar3 + 1;
      if (lVar3 == 0x800) {
        (*(code *)**(undefined8 **)chunk_end)(chunk_end,local_4038,0x4000);
        lVar3 = 0;
      }
      puVar1 = puVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    lVar3 = lVar3 << 3;
  }
  (*(code *)**(undefined8 **)chunk_end)(chunk_end,local_4038,lVar3);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}